

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud,size_t size,uint16_t align)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0x12;
  if (ud->offset != 0) {
    uVar2 = ud->offset + ud->base;
    if (uVar2 <= ud->end) {
      iVar1 = 10;
      if ((!CARRY4((uint)size,uVar2)) && (iVar1 = 9, (uint)size + uVar2 <= ud->end)) {
        iVar1 = 0xb;
        if ((uVar2 & align - 1) == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud, size_t size, uint16_t align)
{
    return verify_struct(ud->end, ud->base, ud->offset, (uoffset_t)size, align);
}